

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiTextureRenderTargetDescription::QRhiTextureRenderTargetDescription
          (QRhiTextureRenderTargetDescription *this,QRhiColorAttachment *colorAttachment,
          QRhiTexture *depthTexture)

{
  QVarLengthArray<QRhiColorAttachment,_8LL> *in_RDX;
  QVarLengthArray<QRhiColorAttachment,_8LL> *in_RDI;
  
  QVarLengthArray<QRhiColorAttachment,_8LL>::QVarLengthArray(in_RDI);
  in_RDI[1].super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.a = 0;
  in_RDI[1].super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s = (qsizetype)in_RDX;
  in_RDI[1].super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.ptr = (void *)0x0;
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[0] = '\0';
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[1] = '\0';
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[2] = '\0';
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[3] = '\0';
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[4] = '\0';
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[5] = '\0';
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[6] = '\0';
  in_RDI[1].super_QVLAStorage<48UL,_8UL,_8LL>.array[7] = '\0';
  QVarLengthArray<QRhiColorAttachment,_8LL>::append(in_RDX,(QRhiColorAttachment *)in_RDI);
  return;
}

Assistant:

QRhiTextureRenderTargetDescription::QRhiTextureRenderTargetDescription(const QRhiColorAttachment &colorAttachment,
                                                                       QRhiTexture *depthTexture)
    : m_depthTexture(depthTexture)
{
    m_colorAttachments.append(colorAttachment);
}